

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O0

cmListFileContext *
cmConditionEvaluator::GetConditionContext
          (cmListFileContext *__return_storage_ptr__,cmMakefile *mf,cmCommandContext *command,
          string *filePath)

{
  Snapshot snapshot;
  bool bVar1;
  cmake *this;
  string local_98;
  Snapshot local_78;
  undefined1 local_60 [8];
  cmOutputConverter converter;
  string *filePath_local;
  cmCommandContext *command_local;
  cmMakefile *mf_local;
  cmListFileContext *context;
  
  cmListFileContext::FromCommandContext(__return_storage_ptr__,command,filePath);
  this = cmMakefile::GetCMakeInstance(mf);
  bVar1 = cmake::GetIsInTryCompile(this);
  if (!bVar1) {
    cmMakefile::GetStateSnapshot(&local_78,mf);
    snapshot.Position.Tree = local_78.Position.Tree;
    snapshot.State = local_78.State;
    snapshot.Position.Position = local_78.Position.Position;
    cmOutputConverter::cmOutputConverter((cmOutputConverter *)local_60,snapshot);
    cmOutputConverter::Convert
              (&local_98,(cmOutputConverter *)local_60,&__return_storage_ptr__->FilePath,HOME,
               UNCHANGED);
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->FilePath,(string *)&local_98)
    ;
    std::__cxx11::string::~string((string *)&local_98);
  }
  return __return_storage_ptr__;
}

Assistant:

cmListFileContext cmConditionEvaluator::GetConditionContext(
    cmMakefile* mf,
    const cmCommandContext& command,
    const std::string& filePath)
{
  cmListFileContext context =
      cmListFileContext::FromCommandContext(
        command,
        filePath);

  if(!mf->GetCMakeInstance()->GetIsInTryCompile())
    {
    cmOutputConverter converter(mf->GetStateSnapshot());
    context.FilePath = converter.Convert(context.FilePath,
                                         cmOutputConverter::HOME);
    }
  return context;
}